

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t local_208;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_write_t write_req;
  
  init_process_options("spawn_helper3",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  stdio[0].data.stream = (uv_stream_t *)&in;
  close(0);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    local_208 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    iVar1 = uv_write(&write_req,(uv_stream_t *)&in,&local_208,1,write_cb);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        if (exit_cb_called == 1) {
          if (close_cb_called == 2) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0x40a;
          }
          else {
            pcVar4 = "close_cb_called == 2";
            uVar3 = 0x408;
          }
        }
        else {
          pcVar4 = "exit_cb_called == 1";
          uVar3 = 0x407;
        }
      }
      else {
        pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar3 = 0x405;
      }
    }
    else {
      pcVar4 = "0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb)";
      uVar3 = 0x403;
    }
  }
  else {
    pcVar4 = "0 == uv_spawn(uv_default_loop(), &process, &options)";
    uVar3 = 0x400;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* process, child stdin */

  MAKE_VALGRIND_HAPPY();
  return 0;
}